

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapic.cc
# Opt level: O1

void __thiscall
rapic::client::client
          (client *this,size_t buffer_size,time_t keepalive_period,time_t inactivity_timeout)

{
  uchar *puVar1;
  
  (this->address_)._M_dataplus._M_p = (pointer)&(this->address_).field_2;
  (this->address_)._M_string_length = 0;
  (this->address_).field_2._M_local_buf[0] = '\0';
  (this->service_)._M_dataplus._M_p = (pointer)&(this->service_).field_2;
  (this->service_)._M_string_length = 0;
  (this->service_).field_2._M_local_buf[0] = '\0';
  this->keepalive_period_ = keepalive_period;
  this->inactivity_timeout_ = inactivity_timeout;
  (this->filters_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->filters_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->filters_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->socket_ = -1;
  *(undefined8 *)&this->state_ = 0;
  *(undefined8 *)((long)&this->last_keepalive_ + 4) = 0;
  *(undefined4 *)((long)&this->last_activity_ + 4) = 0;
  (this->wbuffer_)._M_dataplus._M_p = (pointer)&(this->wbuffer_).field_2;
  (this->wbuffer_)._M_string_length = 0;
  (this->wbuffer_).field_2._M_local_buf[0] = '\0';
  puVar1 = (uchar *)operator_new__(buffer_size);
  (this->buffer_)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
  _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = puVar1;
  this->capacity_ = buffer_size;
  (this->wcount_).super___atomic_base<unsigned_long>._M_i = 0;
  (this->rcount_).super___atomic_base<unsigned_long>._M_i = 0;
  this->cur_type_ = ~mssg;
  this->cur_size_ = 0;
  return;
}

Assistant:

client::client(size_t buffer_size, time_t keepalive_period, time_t inactivity_timeout)
  : keepalive_period_{keepalive_period}
  , inactivity_timeout_{inactivity_timeout}
  , socket_{-1}
  , state_{rapic::connection_state::disconnected}
  , last_keepalive_{0}
  , last_activity_{0}
  , buffer_{new uint8_t[buffer_size]}
  , capacity_{buffer_size}
  , wcount_{0}
  , rcount_{0}
  , cur_type_{no_message}
  , cur_size_{0}
{ }